

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_157793::BuildEngineImpl::cancelRemainingTasks(BuildEngineImpl *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  RuleInfo *this_00;
  pointer pRVar3;
  _Elt_pointer pTVar4;
  _Map_pointer ppTVar5;
  pointer pTVar6;
  _Elt_pointer ppTVar7;
  _Map_pointer pppTVar8;
  _Elt_pointer pTVar9;
  _Elt_pointer pTVar10;
  _Elt_pointer ppTVar11;
  _Elt_pointer ppTVar12;
  TaskInfo *pTVar13;
  __node_base *p_Var14;
  ulong uVar15;
  _Map_pointer extraout_RDX;
  _Map_pointer __nfinish;
  _Map_pointer extraout_RDX_00;
  _Map_pointer __nfinish_00;
  __node_base *p_Var16;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_38;
  
  do {
    if (this->numOutstandingUnfinishedTasks == 0) {
      std::mutex::lock(&this->taskInfosMutex);
      p_Var16 = &(this->taskInfos)._M_h._M_before_begin;
      __nfinish = extraout_RDX;
      while( true ) {
        p_Var16 = p_Var16->_M_nxt;
        if (p_Var16 == (__node_base *)0x0) {
          p_Var14 = &(this->ruleInfos)._M_h._M_before_begin;
          while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
            if (*(int *)&p_Var14[0x13]._M_nxt == 1) {
              *(undefined4 *)&p_Var14[0x13]._M_nxt = 0;
            }
          }
          pRVar3 = (this->ruleInfosToScan).
                   super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this->ruleInfosToScan).
              super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
              ._M_impl.super__Vector_impl_data._M_finish != pRVar3) {
            (this->ruleInfosToScan).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
            ._M_impl.super__Vector_impl_data._M_finish = pRVar3;
          }
          pTVar4 = (this->inputRequests).
                   super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last;
          ppTVar5 = (this->inputRequests).
                    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          pTVar9 = (this->inputRequests).
                   super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          pTVar10 = (this->inputRequests).
                    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first;
          std::
          _Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ::_M_destroy_nodes((_Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                              *)(ppTVar5 + 1),
                             (this->inputRequests).
                             super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node + 1,__nfinish);
          (this->inputRequests).
          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur = pTVar9;
          (this->inputRequests).
          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first = pTVar10;
          (this->inputRequests).
          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last = pTVar4;
          (this->inputRequests).
          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node = ppTVar5;
          pTVar6 = (this->finishedInputRequests).
                   super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this->finishedInputRequests).
              super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
              ._M_impl.super__Vector_impl_data._M_finish != pTVar6) {
            (this->finishedInputRequests).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
            ._M_impl.super__Vector_impl_data._M_finish = pTVar6;
          }
          ppTVar7 = (this->readyTaskInfos).
                    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last;
          pppTVar8 = (this->readyTaskInfos).
                     super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
          ppTVar11 = (this->readyTaskInfos).
                     super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
          ppTVar12 = (this->readyTaskInfos).
                     super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first;
          std::
          _Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
          ::_M_destroy_nodes((_Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                              *)(pppTVar8 + 1),
                             (this->readyTaskInfos).
                             super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node + 1,__nfinish_00);
          (this->readyTaskInfos).
          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur = ppTVar11;
          (this->readyTaskInfos).
          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first = ppTVar12;
          (this->readyTaskInfos).
          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last = ppTVar7;
          (this->readyTaskInfos).
          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node = pppTVar8;
          ppTVar1 = (this->finishedTaskInfos).
                    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((this->finishedTaskInfos).
              super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish != ppTVar1) {
            (this->finishedTaskInfos).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppTVar1;
          }
          std::
          _Hashtable<llbuild::core::Task_*,_std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::Task_*>,_std::hash<llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::clear(&(this->taskInfos)._M_h);
          pthread_mutex_unlock((pthread_mutex_t *)&this->taskInfosMutex);
          return;
        }
        this_00 = (RuleInfo *)p_Var16[9]._M_nxt;
        pTVar13 = RuleInfo::getPendingTaskInfo(this_00);
        if ((TaskInfo *)(p_Var16 + 2) != pTVar13) break;
        RuleInfo::setPendingTaskInfo(this_00,(TaskInfo *)0x0);
        this_00->state = Incomplete;
        __nfinish = extraout_RDX_00;
      }
      __assert_fail("taskInfo == ruleInfo->getPendingTaskInfo()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                    ,0x553,"void (anonymous namespace)::BuildEngineImpl::cancelRemainingTasks()");
    }
    std::unique_lock<std::mutex>::unique_lock(&local_38,&this->finishedTaskInfosMutex);
    ppTVar1 = (this->finishedTaskInfos).
              super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar2 = (this->finishedTaskInfos).
              super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppTVar1 == ppTVar2) {
      std::condition_variable::wait((unique_lock *)&this->finishedTaskInfosCondition);
    }
    else {
      uVar15 = (long)ppTVar2 - (long)ppTVar1 >> 3;
      if (this->numOutstandingUnfinishedTasks < uVar15) {
        __assert_fail("finishedTaskInfos.size() <= numOutstandingUnfinishedTasks",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x53b,"void (anonymous namespace)::BuildEngineImpl::cancelRemainingTasks()");
      }
      this->numOutstandingUnfinishedTasks = this->numOutstandingUnfinishedTasks - (int)uVar15;
      (this->finishedTaskInfos).
      super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar1;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_38);
  } while( true );
}

Assistant:

void cancelRemainingTasks() {
    // We need to wait for any currently running tasks to be reported as
    // complete. Not doing this would mean we could get asynchronous calls
    // attempting to modify the task state concurrently with the cancellation
    // process, which isn't something we want to need to synchronize on.
    //
    // We don't process the requests at all, we simply drain them. In practice,
    // we expect clients to implement cancellation in conjection with causing
    // long-running tasks to also cancel and fail, so preserving those results
    // is not valuable.
    while (numOutstandingUnfinishedTasks != 0) {
        std::unique_lock<std::mutex> lock(finishedTaskInfosMutex);
        if (finishedTaskInfos.empty()) {
          finishedTaskInfosCondition.wait(lock);
        } else {
          assert(finishedTaskInfos.size() <= numOutstandingUnfinishedTasks);
          numOutstandingUnfinishedTasks -= finishedTaskInfos.size();
          finishedTaskInfos.clear();
        }
    }

    std::lock_guard<std::mutex> guard(taskInfosMutex);

    for (auto& it: taskInfos) {
      // Cancel the task, marking it incomplete.
      //
      // This will force it to rerun in a later build, but since it was already
      // running in this build that was almost certainly going to be
      // required. Technically, there are rare situations where it wouldn't have
      // to rerun (e.g., if resultIsValid becomes true after being false in this
      // run), and if we were willing to restore the tasks state--either by
      // keeping the old one or by restoring from the database--we could ensure
      // that doesn't happen.
      //
      // NOTE: Actually, we currently don't sync this write to the database, so
      // in some cases we do actually preserve this information (if the client
      // ends up cancelling, then reloading froom the database).
      TaskInfo* taskInfo = &it.second;
      RuleInfo* ruleInfo = taskInfo->forRuleInfo;
      assert(taskInfo == ruleInfo->getPendingTaskInfo());
      ruleInfo->setPendingTaskInfo(nullptr);
      ruleInfo->setCancelled();
    }

    // FIXME: This is currently an O(n) operation that could be relatively
    // expensive on larger projects.  We should be able to do something more
    // targeted. rdar://problem/39386591
    for (auto& it: ruleInfos) {
      // Cancel outstanding activity on rules
      if (it.second.isScanning()) {
        it.second.setCancelled();
      }
    }

    // Delete all of the tasks.
    ruleInfosToScan.clear();
    inputRequests.clear();
    finishedInputRequests.clear();
    readyTaskInfos.clear();
    finishedTaskInfos.clear();
    taskInfos.clear();
  }